

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LiteralString.cpp
# Opt level: O0

LiteralString *
Js::LiteralString::New(StaticType *type,char16 *content,charcount_t charLength,Recycler *recycler)

{
  Recycler *alloc;
  LiteralString *this;
  TrackAllocData local_50;
  Recycler *local_28;
  Recycler *recycler_local;
  char16 *pcStack_18;
  charcount_t charLength_local;
  char16 *content_local;
  StaticType *type_local;
  
  local_28 = recycler;
  recycler_local._4_4_ = charLength;
  pcStack_18 = content;
  content_local = (char16 *)type;
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_50,(type_info *)&typeinfo,0,0xffffffffffffffff,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/LiteralString.cpp"
             ,0x24);
  alloc = Memory::Recycler::TrackAllocInfo(recycler,&local_50);
  this = (LiteralString *)new<Memory::Recycler>(0x20,alloc,0x43c4b0);
  LiteralString(this,(StaticType *)content_local,pcStack_18,recycler_local._4_4_);
  return this;
}

Assistant:

LiteralString* LiteralString::New(StaticType* type, const char16* content, charcount_t charLength, Recycler* recycler)
    {
        return RecyclerNew(recycler, LiteralString, type, content, charLength);
    }